

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

index_t GEO::Process::os_number_of_cores(void)

{
  long lVar1;
  
  lVar1 = sysconf(0x54);
  return (index_t)lVar1;
}

Assistant:

index_t os_number_of_cores() {
#if defined(GEO_OS_ANDROID)
            int nb_cores = android_get_number_of_cores();
            geo_assert(nb_cores > 0);
            return index_t(nb_cores);
#elif defined(GEO_OS_EMSCRIPTEN)
#  ifdef __EMSCRIPTEN_PTHREADS__
	   return index_t(emscripten_num_logical_cores());
#  else
	   return 1;
#  endif	   
#else	    
            return index_t(sysconf(_SC_NPROCESSORS_ONLN));
#endif
        }